

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O0

rect<int> __thiscall irr::gui::CGUITabControl::calcTabPos(CGUITabControl *this)

{
  rect<int> rVar1;
  int iVar2;
  rect<int> *in_RDI;
  bool bVar3;
  rect<int> r;
  uint local_10;
  uint uStack_c;
  int local_8;
  int iStack_4;
  
  core::rect<int>::rect(in_RDI);
  local_8 = core::rect<int>::getWidth(in_RDI + 4);
  bVar3 = (in_RDI[0x15].LowerRightCorner.Y & 1) != 0;
  if (bVar3) {
    local_8 = local_8 + -1;
  }
  local_10 = (uint)bVar3;
  if (in_RDI[0x16].UpperLeftCorner.Y == 0) {
    uStack_c = in_RDI[0x16].UpperLeftCorner.X + 2;
    iVar2 = core::rect<int>::getHeight(in_RDI + 4);
    iStack_4 = iVar2 + -1;
    if ((in_RDI[0x15].LowerRightCorner.Y & 1) != 0) {
      iStack_4 = iVar2 + -2;
    }
  }
  else {
    iStack_4 = core::rect<int>::getHeight(in_RDI + 4);
    iStack_4 = iStack_4 - (in_RDI[0x16].UpperLeftCorner.X + 2);
    uStack_c = (uint)((in_RDI[0x15].LowerRightCorner.Y & 1) != 0);
  }
  rVar1.UpperLeftCorner.Y = uStack_c;
  rVar1.UpperLeftCorner.X = local_10;
  rVar1.LowerRightCorner.X = local_8;
  rVar1.LowerRightCorner.Y = iStack_4;
  return rVar1;
}

Assistant:

core::rect<s32> CGUITabControl::calcTabPos()
{
	core::rect<s32> r;
	r.UpperLeftCorner.X = 0;
	r.LowerRightCorner.X = AbsoluteRect.getWidth();
	if (Border) {
		++r.UpperLeftCorner.X;
		--r.LowerRightCorner.X;
	}

	if (VerticalAlignment == EGUIA_UPPERLEFT) {
		r.UpperLeftCorner.Y = TabHeight + 2;
		r.LowerRightCorner.Y = AbsoluteRect.getHeight() - 1;
		if (Border) {
			--r.LowerRightCorner.Y;
		}
	} else {
		r.UpperLeftCorner.Y = 0;
		r.LowerRightCorner.Y = AbsoluteRect.getHeight() - (TabHeight + 2);
		if (Border) {
			++r.UpperLeftCorner.Y;
		}
	}

	return r;
}